

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * ParseXMLElement(TidyDocImpl *doc,Node *element,GetTokenMode mode)

{
  Lexer *pLVar1;
  Bool BVar2;
  int iVar3;
  NodeType NVar4;
  uint uVar5;
  uint code;
  Node *pNVar6;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (element == (Node *)0x0) {
    prvTidypopMemory(doc);
    goto LAB_0013d16e;
  }
  BVar2 = prvTidyXMLPreserveWhiteSpace(doc,element);
  memory.reentry_mode = Preformatted;
  if (BVar2 == no) {
    memory.reentry_mode = mode;
  }
  InsertMisc(&doc->root,element);
  BVar2 = prvTidynodeIsText(element);
  memory.original_node = element;
  if (BVar2 == no) {
    while (memory.reentry_node = prvTidyGetToken(doc,memory.reentry_mode),
          memory.reentry_node != (Node *)0x0) {
      NVar4 = (memory.reentry_node)->type;
      if (NVar4 == EndTag) {
        if ((memory.reentry_node)->element == (ctmbstr)0x0) goto LAB_0013d175;
        if ((memory.original_node)->element != (ctmbstr)0x0) {
          iVar3 = prvTidytmbstrcmp((memory.reentry_node)->element,(memory.original_node)->element);
          if (iVar3 != 0) {
            NVar4 = (memory.reentry_node)->type;
            goto LAB_0013d1e6;
          }
          prvTidyFreeNode(doc,memory.reentry_node);
          (memory.original_node)->closed = yes;
          break;
        }
LAB_0013d17a:
        code = 0x286;
        pNVar6 = memory.original_node;
LAB_0013d197:
        prvTidyReport(doc,pNVar6,memory.reentry_node,code);
        prvTidyFreeNode(doc,memory.reentry_node);
      }
      else {
LAB_0013d1e6:
        if (NVar4 == EndTag) {
LAB_0013d175:
          if (memory.original_node != (Node *)0x0) goto LAB_0013d17a;
          pNVar6 = (Node *)0x0;
          code = 0x285;
          goto LAB_0013d197;
        }
        if (NVar4 == StartTag) {
          prvTidypushMemory(doc,(TidyParserMemory)
                                ZEXT2848(CONCAT424(memory.reentry_mode,
                                                   CONCAT816(memory.reentry_node,
                                                             CONCAT88(memory.original_node,
                                                                      ParseXMLElement)))));
          return memory.reentry_node;
        }
LAB_0013d16e:
        prvTidyInsertNodeAtEnd(memory.original_node,memory.reentry_node);
      }
    }
    pNVar6 = (memory.original_node)->content;
    BVar2 = prvTidynodeIsText(pNVar6);
    if ((((memory.reentry_mode != Preformatted) && (BVar2 != no)) &&
        (pLVar1->lexbuf[pNVar6->start] == ' ')) &&
       (uVar5 = pNVar6->start + 1, pNVar6->start = uVar5, pNVar6->end <= uVar5)) {
      prvTidyDiscardElement(doc,pNVar6);
    }
    pNVar6 = (memory.original_node)->last;
    BVar2 = prvTidynodeIsText(pNVar6);
    if (((memory.reentry_mode != Preformatted) && (BVar2 != no)) &&
       ((uVar5 = pNVar6->end - 1, pLVar1->lexbuf[uVar5] == ' ' &&
        (pNVar6->end = uVar5, uVar5 <= pNVar6->start)))) {
      prvTidyDiscardElement(doc,pNVar6);
    }
  }
  else {
    prvTidyReport(doc,&doc->root,element,0x235);
    prvTidyFreeNode(doc,element);
  }
  return (Node *)0x0;
}

Assistant:

static Node* ParseXMLElement(TidyDocImpl* doc, Node *element, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;

    if ( element == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        element = memory.original_node;
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        mode = memory.reentry_mode;
        TY_(InsertNodeAtEnd)(element, node); /* The only re-entry action needed. */
    }
    else
    {
        /* if node is pre or has xml:space="preserve" then do so */
        if ( TY_(XMLPreserveWhiteSpace)(doc, element) )
            mode = Preformatted;

        /* deal with comments etc. */
        InsertMisc( &doc->root, element);
        
        /* we shouldn't have plain text at this point. */
        if (TY_(nodeIsText)(element))
        {
            TY_(Report)(doc, &doc->root, element, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, element);
            return NULL;
        }
    }
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->type == EndTag &&
           node->element && element->element &&
           TY_(tmbstrcmp)(node->element, element->element) == 0)
        {
            TY_(FreeNode)( doc, node);
            element->closed = yes;
            break;
        }

        /* discard unexpected end tags */
        if (node->type == EndTag)
        {
            if (element)
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_IN);
            else
                TY_(Report)(doc, element, node, UNEXPECTED_ENDTAG_ERR);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* parse content on seeing start tag */
        if (node->type == StartTag)
        {
            TidyParserMemory memory = {0};
            memory.identity = ParseXMLElement;
            memory.original_node = element;
            memory.reentry_node = node;
            memory.reentry_mode = mode;
            TY_(pushMemory)( doc, memory );
            return node;
        }

        TY_(InsertNodeAtEnd)(element, node);
    } /* while */

    /*
     if first child is text then trim initial space and
     delete text node if it is empty.
    */

    node = element->content;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->start] == ' ' )
        {
            node->start++;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }

    /*
     if last child is text then trim final space and
     delete the text node if it is empty
    */

    node = element->last;

    if (TY_(nodeIsText)(node) && mode != Preformatted)
    {
        if ( lexer->lexbuf[node->end - 1] == ' ' )
        {
            node->end--;

            if (node->start >= node->end)
                TY_(DiscardElement)( doc, node );
        }
    }
    return NULL;
}